

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

QLayoutItem * ownershipCleanedItem(QFormLayoutItem *item,QFormLayout *layout)

{
  int iVar1;
  undefined4 extraout_var;
  QLayoutItem *pQVar3;
  QObject *pQVar2;
  
  if (item == (QFormLayoutItem *)0x0) {
    pQVar3 = (QLayoutItem *)0x0;
  }
  else {
    pQVar3 = item->item;
    operator_delete(item,0x40);
    iVar1 = (*pQVar3->_vptr_QLayoutItem[0xe])(pQVar3);
    pQVar2 = (QObject *)CONCAT44(extraout_var,iVar1);
    if ((pQVar2 != (QObject *)0x0) && (*(QFormLayout **)(*(long *)(pQVar2 + 8) + 0x10) == layout)) {
      QObject::setParent(pQVar2);
    }
  }
  return pQVar3;
}

Assistant:

static QLayoutItem *ownershipCleanedItem(QFormLayoutItem *item, QFormLayout *layout)
{
    if (!item)
        return nullptr;

    // grab ownership back from the QFormLayoutItem
    QLayoutItem *i = item->item;
    item->item = nullptr;
    delete item;

    if (QLayout *l = i->layout()) {
        // sanity check in case the user passed something weird to QObject::setParent()
        if (l->parent() == layout)
            l->setParent(nullptr);
    }

    return i;
}